

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<double,_2,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  double **ppdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  int *piVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  double *pdVar37;
  ulong uVar38;
  int i;
  ulong uVar39;
  double *pdVar40;
  int iVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  double __x;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double sumOverJD1;
  undefined1 auVar66 [16];
  int local_104;
  
  for (uVar43 = 0; uVar43 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar43 = uVar43 + 1
      ) {
    local_104 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar43]];
    iVar13 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar43] + 1];
    lVar35 = (long)iVar13;
    lVar30 = (long)local_104;
    iVar32 = iVar13 - local_104;
    memset(this->integrationTmp + this->kStateCount * local_104,0,
           (long)(this->kStateCount * iVar32) << 3);
    memset(this->firstDerivTmp + this->kStateCount * local_104,0,
           (long)(this->kStateCount * iVar32) << 3);
    memset(this->secondDerivTmp + this->kStateCount * local_104,0,
           (long)(iVar32 * this->kStateCount) << 3);
    iVar32 = cumulativeScaleIndices[uVar43];
    iVar14 = childBufferIndices[uVar43];
    ppdVar17 = this->gTransitionMatrices;
    pdVar18 = ppdVar17[firstDerivativeIndices[uVar43]];
    pdVar19 = ppdVar17[secondDerivativeIndices[uVar43]];
    pdVar20 = ppdVar17[probabilityIndices[uVar43]];
    pdVar21 = this->gCategoryWeights[categoryWeightsIndices[uVar43]];
    pdVar22 = this->gStateFrequencies[stateFrequenciesIndices[uVar43]];
    pdVar23 = this->gPartials[parentBufferIndices[uVar43]];
    if ((iVar14 < this->kTipCount) && (piVar24 = this->gTipStates[iVar14], piVar24 != (int *)0x0)) {
      uVar29 = this->kStateCount;
      iVar14 = this->kPartialsPaddedStateCount;
      uVar15 = this->kCategoryCount;
      iVar41 = iVar14 * local_104;
      iVar16 = this->kPatternCount;
      for (uVar36 = 0; uVar36 != (~((int)uVar15 >> 0x1f) & uVar15); uVar36 = uVar36 + 1) {
        iVar28 = this->kMatrixSize;
        lVar42 = (long)iVar41;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = pdVar21[uVar36];
        pdVar37 = pdVar23 + lVar42;
        iVar41 = uVar29 * local_104;
        for (lVar44 = lVar30; lVar44 < lVar35; lVar44 = lVar44 + 1) {
          pdVar40 = this->integrationTmp;
          pdVar25 = this->firstDerivTmp;
          iVar33 = this->kTransPaddedStateCount;
          lVar34 = (long)piVar24[lVar44] + (long)(iVar28 * (int)uVar36);
          pdVar26 = this->secondDerivTmp;
          for (uVar39 = 0; (~((int)uVar29 >> 0x1f) & uVar29) != uVar39; uVar39 = uVar39 + 1) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar40[(long)iVar41 + uVar39];
            auVar52._8_8_ = 0;
            auVar52._0_8_ = pdVar20[lVar34] * pdVar37[uVar39];
            auVar47 = vfmadd213sd_fma(auVar52,auVar46,auVar1);
            pdVar40[(long)iVar41 + uVar39] = auVar47._0_8_;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pdVar25[(long)iVar41 + uVar39];
            auVar53._8_8_ = 0;
            auVar53._0_8_ = pdVar18[lVar34] * pdVar37[uVar39];
            auVar47 = vfmadd213sd_fma(auVar53,auVar46,auVar2);
            pdVar25[(long)iVar41 + uVar39] = auVar47._0_8_;
            pdVar27 = pdVar19 + lVar34;
            lVar34 = lVar34 + iVar33;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar26[(long)iVar41 + uVar39];
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *pdVar27 * pdVar37[uVar39];
            auVar47 = vfmadd213sd_fma(auVar54,auVar46,auVar3);
            pdVar26[(long)iVar41 + uVar39] = auVar47._0_8_;
          }
          iVar41 = iVar41 + (int)uVar39;
          pdVar37 = pdVar37 + iVar14;
          lVar42 = lVar42 + iVar14;
        }
        iVar41 = (int)lVar42 + ((local_104 - iVar13) + iVar16) * iVar14;
      }
    }
    else {
      pdVar37 = this->gPartials[iVar14];
      iVar14 = this->kPartialsPaddedStateCount;
      uVar29 = this->kStateCount;
      uVar15 = this->kCategoryCount;
      iVar16 = this->kPatternCount;
      iVar41 = iVar14 * local_104;
      for (uVar36 = 0; uVar36 != (~((int)uVar15 >> 0x1f) & uVar15); uVar36 = uVar36 + 1) {
        lVar44 = (long)iVar41;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = pdVar21[uVar36];
        pdVar40 = pdVar37 + lVar44;
        iVar41 = this->kMatrixSize;
        uVar39 = (ulong)(uVar29 * local_104);
        for (iVar28 = local_104; iVar28 < iVar13; iVar28 = iVar28 + 1) {
          pdVar25 = this->integrationTmp;
          pdVar26 = this->firstDerivTmp;
          pdVar27 = this->secondDerivTmp;
          uVar39 = (ulong)(int)uVar39;
          uVar38 = 0;
          iVar33 = iVar41 * (int)uVar36;
          while (uVar38 != (~((int)uVar29 >> 0x1f) & uVar29)) {
            auVar62 = ZEXT816(0) << 0x40;
            auVar65 = ZEXT816(0) << 0x40;
            auVar55 = ZEXT816(0) << 0x40;
            for (uVar31 = 0; uVar29 != uVar31; uVar31 = uVar31 + 1) {
              auVar66._8_8_ = 0;
              auVar66._0_8_ = pdVar40[uVar31];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar20[(long)iVar33 + uVar31];
              auVar62 = vfmadd231sd_fma(auVar62,auVar66,auVar4);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = pdVar18[(long)iVar33 + uVar31];
              auVar65 = vfmadd231sd_fma(auVar65,auVar66,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = pdVar19[(long)iVar33 + uVar31];
              auVar55 = vfmadd231sd_fma(auVar55,auVar66,auVar6);
            }
            iVar33 = iVar33 + uVar29 + 2;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = pdVar25[uVar39];
            auVar63._8_8_ = 0;
            auVar63._0_8_ = auVar62._0_8_ * pdVar23[lVar44 + uVar38];
            auVar62 = vfmadd213sd_fma(auVar63,auVar47,auVar7);
            pdVar25[uVar39] = auVar62._0_8_;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = pdVar26[uVar39];
            auVar64._8_8_ = 0;
            auVar64._0_8_ = auVar65._0_8_ * pdVar23[lVar44 + uVar38];
            auVar62 = vfmadd213sd_fma(auVar64,auVar47,auVar62);
            pdVar26[uVar39] = auVar62._0_8_;
            lVar42 = lVar44 + uVar38;
            uVar38 = uVar38 + 1;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = pdVar27[uVar39];
            auVar56._8_8_ = 0;
            auVar56._0_8_ = auVar55._0_8_ * pdVar23[lVar42];
            auVar62 = vfmadd213sd_fma(auVar56,auVar47,auVar65);
            pdVar27[uVar39] = auVar62._0_8_;
            uVar39 = uVar39 + 1;
          }
          pdVar40 = pdVar40 + iVar14;
          lVar44 = lVar44 + iVar14;
        }
        iVar41 = (int)lVar44 + ((local_104 - iVar13) + iVar16) * iVar14;
      }
    }
    local_104 = local_104 * this->kStateCount;
    for (lVar44 = lVar30; lVar44 < lVar35; lVar44 = lVar44 + 1) {
      lVar42 = (long)local_104;
      auVar47 = ZEXT816(0) << 0x40;
      auVar62 = ZEXT816(0) << 0x40;
      auVar65 = ZEXT816(0) << 0x40;
      uVar29 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar36 = 0; uVar29 != uVar36; uVar36 = uVar36 + 1) {
        auVar57._8_8_ = 0;
        auVar57._0_8_ = pdVar22[uVar36];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = this->integrationTmp[lVar42 + uVar36];
        auVar47 = vfmadd231sd_fma(auVar47,auVar57,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->firstDerivTmp[lVar42 + uVar36];
        auVar62 = vfmadd231sd_fma(auVar62,auVar57,auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->secondDerivTmp[lVar42 + uVar36];
        auVar65 = vfmadd231sd_fma(auVar65,auVar57,auVar10);
      }
      local_104 = local_104 + uVar29;
      __x = auVar47._0_8_;
      dVar45 = log(__x);
      this->outLogLikelihoodsTmp[lVar44] = dVar45;
      auVar48._0_8_ = auVar62._0_8_ / __x;
      auVar48._8_8_ = 0;
      auVar58._0_8_ = auVar65._0_8_ / __x;
      auVar58._8_8_ = 0;
      this->outFirstDerivativesTmp[lVar44] = auVar48._0_8_;
      auVar47 = vfnmadd231sd_fma(auVar58,auVar48,auVar48);
      this->outSecondDerivativesTmp[lVar44] = auVar47._0_8_;
    }
    if (iVar32 != -1) {
      pdVar18 = this->outLogLikelihoodsTmp;
      pdVar19 = this->gScaleBuffers[iVar32];
      for (lVar44 = lVar30; lVar44 < lVar35; lVar44 = lVar44 + 1) {
        pdVar18[lVar44] = pdVar19[lVar44] + pdVar18[lVar44];
      }
    }
    outSumLogLikelihoodByPartition[uVar43] = 0.0;
    outSumFirstDerivativeByPartition[uVar43] = 0.0;
    outSumSecondDerivativeByPartition[uVar43] = 0.0;
    pdVar18 = this->gPatternWeights;
    pdVar19 = this->outLogLikelihoodsTmp;
    pdVar20 = this->outFirstDerivativesTmp;
    pdVar21 = this->outSecondDerivativesTmp;
    while (lVar30 < lVar35) {
      auVar49._8_8_ = 0;
      auVar49._0_8_ = pdVar19[lVar30];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = pdVar18[lVar30];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = outSumLogLikelihoodByPartition[uVar43];
      auVar47 = vfmadd213sd_fma(auVar59,auVar49,auVar55);
      outSumLogLikelihoodByPartition[uVar43] = auVar47._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = pdVar20[lVar30];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = pdVar18[lVar30];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = outSumFirstDerivativeByPartition[uVar43];
      auVar47 = vfmadd213sd_fma(auVar60,auVar50,auVar11);
      outSumFirstDerivativeByPartition[uVar43] = auVar47._0_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = pdVar21[lVar30];
      auVar61._8_8_ = 0;
      auVar61._0_8_ = pdVar18[lVar30];
      lVar30 = lVar30 + 1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = outSumSecondDerivativeByPartition[uVar43];
      auVar47 = vfmadd213sd_fma(auVar61,auVar51,auVar12);
      outSumSecondDerivativeByPartition[uVar43] = auVar47._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}